

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O0

StructReader * __thiscall
capnp::_::ListReader::getStructElement
          (StructReader *__return_storage_ptr__,ListReader *this,ElementCount index)

{
  byte *pbVar1;
  bool bVar2;
  unsigned_long uVar3;
  ulong uVar4;
  Fault local_c8;
  Fault f_1;
  ulong local_b8;
  DebugExpression<unsigned_long> local_b0;
  undefined1 local_a8 [8];
  DebugComparison<unsigned_long,_unsigned_int> _kjCondition_1;
  WirePointer *structPointers;
  byte *structData;
  unsigned_long indexBit;
  Fault local_58;
  Fault f;
  int *local_48;
  undefined1 local_40 [8];
  DebugComparison<const_int_&,_int> _kjCondition;
  ElementCount index_local;
  ListReader *this_local;
  
  _kjCondition._36_4_ = index;
  local_48 = (int *)kj::_::DebugExpressionStart::operator<<
                              ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&this->nestingLimit);
  f.exception._4_4_ = 0;
  kj::_::DebugExpression<int_const&>::operator>
            ((DebugComparison<const_int_&,_int> *)local_40,(DebugExpression<int_const&> *)&local_48,
             (int *)((long)&f.exception + 4));
  bVar2 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_40);
  if (bVar2) {
    uVar3 = upgradeBound<unsigned_long,unsigned_int>(_kjCondition._36_4_);
    uVar4 = uVar3 * this->step;
    pbVar1 = this->ptr;
    _kjCondition_1._32_8_ = pbVar1 + (uVar4 >> 3) + (this->structDataSize >> 3);
    local_b8 = uVar4 & 7;
    local_b0 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_b8);
    f_1.exception._4_4_ = 0;
    kj::_::DebugExpression<unsigned_long>::operator==
              ((DebugComparison<unsigned_long,_unsigned_int> *)local_a8,&local_b0,
               (uint *)((long)&f_1.exception + 4));
    bVar2 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_a8);
    if (!bVar2) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,unsigned_int>&>
                (&local_c8,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                 ,0xc67,FAILED,"indexBit % BITS_PER_BYTE == ZERO * BITS","_kjCondition,",
                 (DebugComparison<unsigned_long,_unsigned_int> *)local_a8);
      kj::_::Debug::Fault::fatal(&local_c8);
    }
    StructReader::StructReader
              (__return_storage_ptr__,this->segment,this->capTable,pbVar1 + (uVar4 >> 3),
               (WirePointer *)_kjCondition_1._32_8_,this->structDataSize,this->structPointerCount,
               this->nestingLimit + -1);
  }
  else {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<int_const&,int>&,char_const(&)[76]>
              (&local_58,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
               ,0xc5e,FAILED,"nestingLimit > 0",
               "_kjCondition,\"Message is too deeply-nested or contains cycles.  See capnp::ReaderOptions.\""
               ,(DebugComparison<const_int_&,_int> *)local_40,
               (char (*) [76])
               "Message is too deeply-nested or contains cycles.  See capnp::ReaderOptions.");
    StructReader::StructReader(__return_storage_ptr__);
    kj::_::Debug::Fault::~Fault(&local_58);
  }
  return __return_storage_ptr__;
}

Assistant:

StructReader ListReader::getStructElement(ElementCount index) const {
  KJ_REQUIRE(nestingLimit > 0,
             "Message is too deeply-nested or contains cycles.  See capnp::ReaderOptions.") {
    return StructReader();
  }

  auto indexBit = upgradeBound<uint64_t>(index) * step;
  const byte* structData = ptr + indexBit / BITS_PER_BYTE;
  const WirePointer* structPointers =
      reinterpret_cast<const WirePointer*>(structData + structDataSize / BITS_PER_BYTE);

  KJ_DASSERT(indexBit % BITS_PER_BYTE == ZERO * BITS);
  return StructReader(
      segment, capTable, structData, structPointers,
      structDataSize, structPointerCount,
      nestingLimit - 1);
}